

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyboard.c
# Opt level: O1

void __thiscall read_config(void *this,char *config_path)

{
  int iVar1;
  ALLEGRO_CONFIG *cfg;
  ulong uVar2;
  int *piVar3;
  char tmp [64];
  char acStack_78 [72];
  
  cfg = (ALLEGRO_CONFIG *)al_load_config_file(config_path);
  if (cfg == (ALLEGRO_CONFIG *)0x0) {
    cfg = (ALLEGRO_CONFIG *)al_create_config();
  }
  piVar3 = &DAT_00112838;
  uVar2 = 0;
  do {
    snprintf(acStack_78,0x40,"button%d",uVar2 & 0xffffffff);
    iVar1 = get_config_int(cfg,"KEYBOARD",acStack_78,*piVar3);
    *(int *)(*(long *)((long)this + 0x20) + uVar2 * 4) = iVar1;
    uVar2 = uVar2 + 1;
    piVar3 = piVar3 + 1;
  } while (uVar2 != 3);
  al_destroy_config(cfg);
  return;
}

Assistant:

static void read_config(VCONTROLLER * this, const char *config_path)
{
   int i;
   char tmp[64];
   int def[] = {
      ALLEGRO_KEY_LEFT,
      ALLEGRO_KEY_RIGHT,
      ALLEGRO_KEY_SPACE
   };

   ALLEGRO_CONFIG *c = al_load_config_file(config_path);
   if (!c) c = al_create_config();

   for (i = 0; i < 3; i++) {
      snprintf(tmp, sizeof(tmp), "button%d", i);
      ((int *)(this->private_data))[i] =
         get_config_int(c, "KEYBOARD", tmp, def[i]);
   }

   al_destroy_config(c);
}